

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_urlDecode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  char cVar7;
  int iVar8;
  vm_obj_id_t vVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *buf;
  ulong uVar13;
  size_t byte_size;
  
  if (getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar8 = __cxa_guard_acquire(&getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                 ::desc);
    if (iVar8 != 0) {
      getp_urlDecode::desc.min_argc_ = 0;
      getp_urlDecode::desc.opt_argc_ = 0;
      getp_urlDecode::desc.varargs_ = 0;
      __cxa_guard_release(&getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                         );
    }
  }
  iVar8 = CVmObject::get_prop_check_argc(retval,argc,&getp_urlDecode::desc);
  pvVar6 = sp_;
  if (iVar8 == 0) {
    uVar5 = *(undefined4 *)&self_val->field_0x4;
    aVar4 = self_val->val;
    sp_ = sp_ + 1;
    pvVar6->typ = self_val->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    pbVar10 = (byte *)(str + 2);
    byte_size = 0;
    uVar13 = (ulong)*(ushort *)str;
    pbVar12 = pbVar10;
    for (uVar11 = uVar13; uVar11 != 0; uVar11 = uVar11 - 1) {
      if ((2 < uVar11) && (*pbVar12 == 0x25)) {
        iVar8 = is_xdigit((int)(char)pbVar12[1]);
        if (iVar8 != 0) {
          iVar8 = is_xdigit((int)(char)pbVar12[2]);
          if (iVar8 != 0) {
            pbVar12 = pbVar12 + 2;
            uVar11 = uVar11 - 2;
          }
        }
      }
      pbVar12 = pbVar12 + 1;
      byte_size = byte_size + 1;
    }
    vVar9 = create(0,byte_size);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    buf = (byte *)(*(long *)((long)&G_obj_table_X.pages_[vVar9 >> 0xc][vVar9 & 0xfff].ptr_ + 8) + 2)
    ;
    pbVar12 = buf;
    for (; uVar13 != 0; uVar13 = uVar13 - 1) {
      if (*pbVar10 == 0x2b) {
        *pbVar12 = 0x20;
      }
      else {
        if ((2 < uVar13) && (*pbVar10 == 0x25)) {
          iVar8 = is_xdigit((int)(char)pbVar10[1]);
          if (iVar8 != 0) {
            iVar8 = is_xdigit((int)(char)pbVar10[2]);
            if (iVar8 != 0) {
              pbVar1 = pbVar10 + 1;
              bVar2 = pbVar10[2];
              pbVar10 = pbVar10 + 2;
              cVar3 = '\0';
              if ('@' < (char)*pbVar1) {
                cVar3 = '\t';
              }
              cVar7 = -0x30;
              if ('@' < (char)bVar2) {
                cVar7 = -0x37;
              }
              if ('`' < (char)bVar2) {
                cVar7 = -0x57;
              }
              *pbVar12 = cVar7 + bVar2 | (cVar3 + *pbVar1) * '\x10';
              uVar13 = uVar13 - 2;
              goto LAB_002a4b7f;
            }
          }
        }
        *pbVar12 = *pbVar10;
      }
LAB_002a4b7f:
      pbVar10 = pbVar10 + 1;
      pbVar12 = pbVar12 + 1;
    }
    CCharmapToUni::validate((char *)buf,byte_size);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlDecode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the result */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem, ++outlen)
    {
        /* 
         *   if this is a '%xx' sequence, it translates to a single byte;
         *   otherwise just copy the byte as-is 
         */
        if (*p == '%' && rem >= 3 && is_xdigit(*(p+1)) && is_xdigit(*(p+2)))
        {
            /* 
             *   it's a %xx sequence - skip the whole thing and count is as
             *   just one byte of output 
             */
            p += 2;
            rem -= 2;
        }
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *outbuf =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();
    char *dst = outbuf;

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem, ++dst)
    {
        /* 
         *   if it's a '+', translate to a space; otherwise, if this is a
         *   '%xx' sequence, it translates to a single byte; otherwise just
         *   copy the byte as-is 
         */
        if (*p == '+')
        {
            *dst = ' ';
        }
        else if (*p == '%' && rem >= 3
                 && is_xdigit(*(p+1)) && is_xdigit(*(p+2)))
        {
            /* it's a %xx sequence - translate to a byte */
            *dst = (value_of_xdigit(*(p+1)) << 4)
                   | value_of_xdigit(*(p+2));

            /* skip the %xx sequence in the input */
            p += 2;
            rem -= 2;
        }
        else
        {
            /* copy anything else as-is */
            *dst = *p;
        }
    }

    /* validate the resulting UTF8 */
    CCharmapToUni::validate(outbuf, outlen);

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}